

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::DebugNodeTable(ImGuiTable *table)

{
  float fVar1;
  float fVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  ImVec4 *col;
  ImGuiTableColumn *pIVar8;
  char *pcVar9;
  char *pcVar10;
  ImDrawList *pIVar11;
  ImGuiTableSettings *settings_00;
  char *pcVar12;
  char *pcVar13;
  float fVar14;
  float fVar15;
  char *local_3a8;
  float local_344;
  ImGuiTableSettings *settings;
  ImRect r;
  char *name;
  ImGuiTableColumn *column;
  int local_268;
  int n_1;
  int n;
  float sum_weights;
  bool clear_settings;
  ImVec2 local_254;
  byte local_24a;
  byte local_249;
  bool open;
  char *pcStack_248;
  bool is_active;
  char *buf_end;
  char *p;
  char buf [512];
  ImGuiTable *table_local;
  
  buf_end = (char *)&p;
  pcStack_248 = buf + 0x1f8;
  iVar3 = table->LastFrameActive;
  buf._504_8_ = table;
  iVar6 = GetFrameCount();
  local_249 = iVar6 + -2 <= iVar3;
  pcVar7 = " *Inactive*";
  if ((bool)local_249) {
    pcVar7 = "";
  }
  ImFormatString(buf_end,(long)pcStack_248 - (long)buf_end,"Table 0x%08X (%d columns, in \'%s\')%s",
                 (ulong)*(uint *)buf._504_8_,(ulong)*(uint *)(buf._504_8_ + 0x74),
                 **(undefined8 **)(buf._504_8_ + 0x180),pcVar7);
  if ((local_249 & 1) == 0) {
    col = GetStyleColorVec4(1);
    PushStyleColor(0,col);
  }
  local_24a = TreeNode((void *)buf._504_8_,"%s",&p);
  if ((local_249 & 1) == 0) {
    PopStyleColor(1);
  }
  bVar4 = IsItemHovered(0);
  if (bVar4) {
    pIVar11 = GetForegroundDrawList();
    ImDrawList::AddRect(pIVar11,(ImVec2 *)(buf._504_8_ + 0xf0),(ImVec2 *)(buf._504_8_ + 0xf8),
                        0xff00ffff,0.0,0,1.0);
  }
  bVar4 = IsItemVisible();
  if ((bVar4) && (*(char *)(buf._504_8_ + 500) != -1)) {
    pIVar11 = GetForegroundDrawList();
    local_254 = GetItemRectMin();
    _sum_weights = GetItemRectMax();
    ImDrawList::AddRect(pIVar11,&local_254,(ImVec2 *)&sum_weights,0xff00ffff,0.0,0,1.0);
  }
  if ((local_24a & 1) != 0) {
    if (0 < *(short *)(buf._504_8_ + 0x80)) {
      Text("** %d instances of same table! Some data below will refer to last instance.",
           (ulong)((int)*(short *)(buf._504_8_ + 0x80) + 1));
    }
    bVar4 = SmallButton("Clear settings");
    fVar1 = *(float *)(buf._504_8_ + 0xf0);
    fVar2 = *(float *)(buf._504_8_ + 0xf4);
    fVar14 = ImRect::GetWidth((ImRect *)(buf._504_8_ + 0xf0));
    fVar15 = ImRect::GetHeight((ImRect *)(buf._504_8_ + 0xf0));
    pcVar7 = DebugNodeTableGetSizingPolicyDesc(*(ImGuiTableFlags *)(buf._504_8_ + 4));
    BulletText("OuterRect: Pos: (%.1f,%.1f) Size: (%.1f,%.1f) Sizing: \'%s\'",(double)fVar1,
               (double)fVar2,(double)fVar14,(double)fVar15,pcVar7);
    pcVar7 = "";
    if (*(float *)(buf._504_8_ + 0xd4) == 0.0) {
      pcVar7 = " (auto)";
    }
    BulletText("ColumnsGivenWidth: %.1f, ColumnsAutoFitWidth: %.1f, InnerWidth: %.1f%s",
               (double)*(float *)(buf._504_8_ + 0xd8),(double)*(float *)(buf._504_8_ + 0xdc),
               (double)*(float *)(buf._504_8_ + 0xd4),pcVar7);
    BulletText("CellPaddingX: %.1f, CellSpacingX: %.1f/%.1f, OuterPaddingX: %.1f",
               (double)*(float *)(buf._504_8_ + 0xc4),(double)*(float *)(buf._504_8_ + 0xcc),
               (double)*(float *)(buf._504_8_ + 0xd0),(double)*(float *)(buf._504_8_ + 0xc0));
    BulletText("HoveredColumnBody: %d, HoveredColumnBorder: %d",
               (ulong)(uint)(int)*(char *)(buf._504_8_ + 500),
               (ulong)(uint)(int)*(char *)(buf._504_8_ + 0x1f5));
    BulletText("ResizedColumn: %d, ReorderColumn: %d, HeldHeaderColumn: %d",
               (ulong)(uint)(int)*(char *)(buf._504_8_ + 0x1f7),
               (ulong)(uint)(int)*(char *)(buf._504_8_ + 0x1fa),
               (ulong)(uint)(int)*(char *)(buf._504_8_ + 0x1f9));
    n_1 = 0;
    for (local_268 = 0; local_268 < *(int *)(buf._504_8_ + 0x74); local_268 = local_268 + 1) {
      pIVar8 = ImSpan<ImGuiTableColumn>::operator[]
                         ((ImSpan<ImGuiTableColumn> *)(buf._504_8_ + 0x18),local_268);
      if ((pIVar8->Flags & 8U) != 0) {
        pIVar8 = ImSpan<ImGuiTableColumn>::operator[]
                           ((ImSpan<ImGuiTableColumn> *)(buf._504_8_ + 0x18),local_268);
        n_1 = (int)(pIVar8->StretchWeight + (float)n_1);
      }
    }
    for (column._4_4_ = 0; (int)column._4_4_ < *(int *)(buf._504_8_ + 0x74);
        column._4_4_ = column._4_4_ + 1) {
      pIVar8 = ImSpan<ImGuiTableColumn>::operator[]
                         ((ImSpan<ImGuiTableColumn> *)(buf._504_8_ + 0x18),column._4_4_);
      pcVar7 = TableGetColumnName((ImGuiTable *)buf._504_8_,column._4_4_);
      pcVar9 = "";
      if ((int)column._4_4_ < (int)*(char *)(buf._504_8_ + 0x203)) {
        pcVar9 = " (Frozen)";
      }
      if (pIVar8->StretchWeight <= 0.0) {
        local_344 = 0.0;
      }
      else {
        local_344 = (pIVar8->StretchWeight / (float)n_1) * 100.0;
      }
      if ((pIVar8->field_0x65 & 3) == 1) {
        local_3a8 = " (Asc)";
      }
      else {
        local_3a8 = "";
        if ((pIVar8->field_0x65 & 3) == 2) {
          local_3a8 = " (Des)";
        }
      }
      pcVar13 = "";
      if ((pIVar8->Flags & 8U) != 0) {
        pcVar13 = "WidthStretch ";
      }
      pcVar12 = "";
      if ((pIVar8->Flags & 0x10U) != 0) {
        pcVar12 = "WidthFixed ";
      }
      pcVar10 = "";
      if ((pIVar8->Flags & 0x20U) != 0) {
        pcVar10 = "NoResize ";
      }
      ImFormatString((char *)&p,0x200,
                     "Column %d order %d \'%s\': offset %+.2f to %+.2f%s\nEnabled: %d, VisibleX/Y: %d/%d, RequestOutput: %d, SkipItems: %d, DrawChannels: %d,%d\nWidthGiven: %.1f, Request/Auto: %.1f/%.1f, StretchWeight: %.3f (%.1f%%)\nMinX: %.1f, MaxX: %.1f (%+.1f), ClipRect: %.1f to %.1f (+%.1f)\nContentWidth: %.1f,%.1f, HeadersUsed/Ideal %.1f/%.1f\nSort: %d%s, UserID: 0x%08X, Flags: 0x%04X: %s%s%s.."
                     ,(double)(pIVar8->MinX - *(float *)(buf._504_8_ + 0x110)),
                     (double)(pIVar8->MaxX - *(float *)(buf._504_8_ + 0x110)),
                     (double)pIVar8->WidthGiven,(double)pIVar8->WidthRequest,
                     (double)pIVar8->WidthAuto,(double)pIVar8->StretchWeight,(double)local_344,
                     (double)pIVar8->MinX,(ulong)column._4_4_,(ulong)(uint)(int)pIVar8->DisplayOrder
                     ,pcVar7,pcVar9,(uint)(pIVar8->IsEnabled & 1),(uint)(pIVar8->IsVisibleX & 1),
                     (uint)(pIVar8->IsVisibleY & 1),(uint)(pIVar8->IsRequestOutput & 1),
                     (uint)(pIVar8->IsSkipItems & 1),(uint)pIVar8->DrawChannelFrozen,
                     (uint)pIVar8->DrawChannelUnfrozen,(double)pIVar8->MaxX,
                     (double)(pIVar8->MaxX - pIVar8->MinX),(double)(pIVar8->ClipRect).Min.x,
                     (double)(pIVar8->ClipRect).Max.x,
                     (double)((pIVar8->ClipRect).Max.x - (pIVar8->ClipRect).Min.x),
                     (double)(pIVar8->ContentMaxXFrozen - pIVar8->WorkMinX),
                     (double)(pIVar8->ContentMaxXUnfrozen - pIVar8->WorkMinX),
                     (double)(pIVar8->ContentMaxXHeadersUsed - pIVar8->WorkMinX),
                     (double)(pIVar8->ContentMaxXHeadersIdeal - pIVar8->WorkMinX),
                     (int)pIVar8->SortOrder,local_3a8,pIVar8->UserID,pIVar8->Flags,pcVar13,pcVar12,
                     pcVar10);
      Bullet();
      ImVec2::ImVec2(&r.Max,0.0,0.0);
      Selectable((char *)&p,false,0,&r.Max);
      bVar5 = IsItemHovered(0);
      if (bVar5) {
        ImRect::ImRect((ImRect *)&settings,pIVar8->MinX,*(float *)(buf._504_8_ + 0xf4),pIVar8->MaxX,
                       *(float *)(buf._504_8_ + 0xfc));
        pIVar11 = GetForegroundDrawList();
        ImDrawList::AddRect(pIVar11,(ImVec2 *)&settings,&r.Min,0xff00ffff,0.0,0,1.0);
      }
    }
    settings_00 = TableGetBoundSettings((ImGuiTable *)buf._504_8_);
    if (settings_00 != (ImGuiTableSettings *)0x0) {
      DebugNodeTableSettings(settings_00);
    }
    if (bVar4) {
      *(undefined1 *)(buf._504_8_ + 0x212) = 1;
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeTable(ImGuiTable* table)
{
    char buf[512];
    char* p = buf;
    const char* buf_end = buf + IM_ARRAYSIZE(buf);
    const bool is_active = (table->LastFrameActive >= ImGui::GetFrameCount() - 2); // Note that fully clipped early out scrolling tables will appear as inactive here.
    ImFormatString(p, buf_end - p, "Table 0x%08X (%d columns, in '%s')%s", table->ID, table->ColumnsCount, table->OuterWindow->Name, is_active ? "" : " *Inactive*");
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    bool open = TreeNode(table, "%s", buf);
    if (!is_active) { PopStyleColor(); }
    if (IsItemHovered())
        GetForegroundDrawList()->AddRect(table->OuterRect.Min, table->OuterRect.Max, IM_COL32(255, 255, 0, 255));
    if (IsItemVisible() && table->HoveredColumnBody != -1)
        GetForegroundDrawList()->AddRect(GetItemRectMin(), GetItemRectMax(), IM_COL32(255, 255, 0, 255));
    if (!open)
        return;
    if (table->InstanceCurrent > 0)
        ImGui::Text("** %d instances of same table! Some data below will refer to last instance.", table->InstanceCurrent + 1);
    bool clear_settings = SmallButton("Clear settings");
    BulletText("OuterRect: Pos: (%.1f,%.1f) Size: (%.1f,%.1f) Sizing: '%s'", table->OuterRect.Min.x, table->OuterRect.Min.y, table->OuterRect.GetWidth(), table->OuterRect.GetHeight(), DebugNodeTableGetSizingPolicyDesc(table->Flags));
    BulletText("ColumnsGivenWidth: %.1f, ColumnsAutoFitWidth: %.1f, InnerWidth: %.1f%s", table->ColumnsGivenWidth, table->ColumnsAutoFitWidth, table->InnerWidth, table->InnerWidth == 0.0f ? " (auto)" : "");
    BulletText("CellPaddingX: %.1f, CellSpacingX: %.1f/%.1f, OuterPaddingX: %.1f", table->CellPaddingX, table->CellSpacingX1, table->CellSpacingX2, table->OuterPaddingX);
    BulletText("HoveredColumnBody: %d, HoveredColumnBorder: %d", table->HoveredColumnBody, table->HoveredColumnBorder);
    BulletText("ResizedColumn: %d, ReorderColumn: %d, HeldHeaderColumn: %d", table->ResizedColumn, table->ReorderColumn, table->HeldHeaderColumn);
    //BulletText("BgDrawChannels: %d/%d", 0, table->BgDrawChannelUnfrozen);
    float sum_weights = 0.0f;
    for (int n = 0; n < table->ColumnsCount; n++)
        if (table->Columns[n].Flags & ImGuiTableColumnFlags_WidthStretch)
            sum_weights += table->Columns[n].StretchWeight;
    for (int n = 0; n < table->ColumnsCount; n++)
    {
        ImGuiTableColumn* column = &table->Columns[n];
        const char* name = TableGetColumnName(table, n);
        ImFormatString(buf, IM_ARRAYSIZE(buf),
            "Column %d order %d '%s': offset %+.2f to %+.2f%s\n"
            "Enabled: %d, VisibleX/Y: %d/%d, RequestOutput: %d, SkipItems: %d, DrawChannels: %d,%d\n"
            "WidthGiven: %.1f, Request/Auto: %.1f/%.1f, StretchWeight: %.3f (%.1f%%)\n"
            "MinX: %.1f, MaxX: %.1f (%+.1f), ClipRect: %.1f to %.1f (+%.1f)\n"
            "ContentWidth: %.1f,%.1f, HeadersUsed/Ideal %.1f/%.1f\n"
            "Sort: %d%s, UserID: 0x%08X, Flags: 0x%04X: %s%s%s..",
            n, column->DisplayOrder, name, column->MinX - table->WorkRect.Min.x, column->MaxX - table->WorkRect.Min.x, (n < table->FreezeColumnsRequest) ? " (Frozen)" : "",
            column->IsEnabled, column->IsVisibleX, column->IsVisibleY, column->IsRequestOutput, column->IsSkipItems, column->DrawChannelFrozen, column->DrawChannelUnfrozen,
            column->WidthGiven, column->WidthRequest, column->WidthAuto, column->StretchWeight, column->StretchWeight > 0.0f ? (column->StretchWeight / sum_weights) * 100.0f : 0.0f,
            column->MinX, column->MaxX, column->MaxX - column->MinX, column->ClipRect.Min.x, column->ClipRect.Max.x, column->ClipRect.Max.x - column->ClipRect.Min.x,
            column->ContentMaxXFrozen - column->WorkMinX, column->ContentMaxXUnfrozen - column->WorkMinX, column->ContentMaxXHeadersUsed - column->WorkMinX, column->ContentMaxXHeadersIdeal - column->WorkMinX,
            column->SortOrder, (column->SortDirection == ImGuiSortDirection_Ascending) ? " (Asc)" : (column->SortDirection == ImGuiSortDirection_Descending) ? " (Des)" : "", column->UserID, column->Flags,
            (column->Flags & ImGuiTableColumnFlags_WidthStretch) ? "WidthStretch " : "",
            (column->Flags & ImGuiTableColumnFlags_WidthFixed) ? "WidthFixed " : "",
            (column->Flags & ImGuiTableColumnFlags_NoResize) ? "NoResize " : "");
        Bullet();
        Selectable(buf);
        if (IsItemHovered())
        {
            ImRect r(column->MinX, table->OuterRect.Min.y, column->MaxX, table->OuterRect.Max.y);
            GetForegroundDrawList()->AddRect(r.Min, r.Max, IM_COL32(255, 255, 0, 255));
        }
    }
    if (ImGuiTableSettings* settings = TableGetBoundSettings(table))
        DebugNodeTableSettings(settings);
    if (clear_settings)
        table->IsResetAllRequest = true;
    TreePop();
}